

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# upnpapi.c
# Opt level: O0

int UpnpUnSubscribe(UpnpClient_Handle Hnd,char *SubsId)

{
  Upnp_Handle_Type UVar1;
  UpnpString *p;
  UpnpString *SubsIdTmp;
  Handle_Info *pHStack_20;
  int retVal;
  Handle_Info *SInfo;
  char *SubsId_local;
  UpnpClient_Handle Hnd_local;
  
  pHStack_20 = (Handle_Info *)0x0;
  SInfo = (Handle_Info *)SubsId;
  SubsId_local._4_4_ = Hnd;
  p = UpnpString_new();
  UpnpPrintf(UPNP_ALL,API,".upnp/src/api/upnpapi.c",0x92b,"Inside UpnpUnSubscribe\n");
  if (UpnpSdkInit == 1) {
    if (p == (UpnpString *)0x0) {
      SubsIdTmp._4_4_ = 0xffffff98;
    }
    else if (SInfo == (Handle_Info *)0x0) {
      SubsIdTmp._4_4_ = 0xffffff9b;
    }
    else {
      UpnpString_set_String(p,(char *)SInfo);
      HandleReadLock(".upnp/src/api/upnpapi.c",0x93c);
      UVar1 = GetHandleInfo(SubsId_local._4_4_,&stack0xffffffffffffffe0);
      if (UVar1 == HND_CLIENT) {
        HandleUnlock(".upnp/src/api/upnpapi.c",0x945);
        SubsIdTmp._4_4_ = genaUnSubscribe(SubsId_local._4_4_,p);
      }
      else {
        HandleUnlock(".upnp/src/api/upnpapi.c",0x941);
        SubsIdTmp._4_4_ = 0xffffff9c;
      }
    }
  }
  else {
    SubsIdTmp._4_4_ = 0xffffff8c;
  }
  UpnpPrintf(UPNP_ALL,API,".upnp/src/api/upnpapi.c",0x94d,"Exiting UpnpUnSubscribe, retVal=%d\n",
             (ulong)SubsIdTmp._4_4_);
  UpnpString_delete(p);
  return SubsIdTmp._4_4_;
}

Assistant:

int UpnpUnSubscribe(UpnpClient_Handle Hnd, const Upnp_SID SubsId)
{
	struct Handle_Info *SInfo = NULL;
	int retVal;
	UpnpString *SubsIdTmp = UpnpString_new();

	UpnpPrintf(
		UPNP_ALL, API, __FILE__, __LINE__, "Inside UpnpUnSubscribe\n");

	if (UpnpSdkInit != 1) {
		retVal = UPNP_E_FINISH;
		goto exit_function;
	}

	if (SubsIdTmp == NULL) {
		retVal = UPNP_E_OUTOF_MEMORY;
		goto exit_function;
	}
	if (SubsId == NULL) {
		retVal = UPNP_E_INVALID_PARAM;
		goto exit_function;
	}
	UpnpString_set_String(SubsIdTmp, SubsId);

	HandleReadLock(__FILE__, __LINE__);
	switch (GetHandleInfo(Hnd, &SInfo)) {
	case HND_CLIENT:
		break;
	default:
		HandleUnlock(__FILE__, __LINE__);
		retVal = UPNP_E_INVALID_HANDLE;
		goto exit_function;
	}
	HandleUnlock(__FILE__, __LINE__);

	retVal = genaUnSubscribe(Hnd, SubsIdTmp);

exit_function:
	UpnpPrintf(UPNP_ALL,
		API,
		__FILE__,
		__LINE__,
		"Exiting UpnpUnSubscribe, retVal=%d\n",
		retVal);

	UpnpString_delete(SubsIdTmp);

	return retVal;
}